

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  FILE *f;
  
  if (argc == 2) {
    f = fopen(argv[1],"r");
    if (f == (FILE *)0x0) {
      fwrite(anon_var_dwarf_31b5,0x13,1,_stderr);
    }
    init_cos_cache();
    readStream((FILE *)f);
    iVar1 = 0;
  }
  else {
    fwrite(anon_var_dwarf_319f,0x22,1,_stderr);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc != 2) {
        fprintf(stderr, "用法：jpeg_decoder <jpeg file>\n");
        return 1;
    }
    FILE *f = fopen(argv[1], "r");
    if (f == NULL) {
        fprintf(stderr, "檔案開啟失敗\n");
    }
    init_cos_cache();
    readStream(f);
    return 0;
}